

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void rw::flipAlphaBlock5(uint8 *dst,uint8 *src)

{
  int local_2c;
  undefined4 uStack_28;
  int i;
  uint64 flipbits;
  uint64 bits;
  uint8 *src_local;
  uint8 *dst_local;
  
  *dst = *src;
  dst[1] = src[1];
  flipbits = *(uint64 *)(src + 2);
  _uStack_28 = 0;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    _uStack_28 = flipbits & 0xfff | _uStack_28 << 0xc;
    flipbits = flipbits >> 0xc;
  }
  *(undefined4 *)(dst + 2) = uStack_28;
  *(undefined2 *)(dst + 6) = (undefined2)i;
  return;
}

Assistant:

static void
flipAlphaBlock5(uint8 *dst, uint8 *src)
{
	// color
	dst[0] = src[0];
	dst[1] = src[1];
	// bits
	uint64 bits = *(uint64*)&src[2];
	uint64 flipbits = 0;
	for(int i = 0; i < 4; i++){
		flipbits <<= 12;
		flipbits |= bits & 0xFFF;
		bits >>= 12;
	}
	memcpy(dst+2, &flipbits, 6);
}